

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O1

MPP_RET mpp_dec_start_normal(MppDecImpl *dec)

{
  MppCodingType MVar1;
  MppThread *this;
  
  MVar1 = dec->coding;
  this = (MppThread *)operator_new(0x198);
  if (MVar1 == MPP_VIDEO_CodingMJPEG) {
    MppThread::MppThread(this,mpp_dec_advanced_thread,dec->mpp,"mpp_dec_parser");
    dec->thread_parser = this;
  }
  else {
    MppThread::MppThread(this,mpp_dec_parser_thread,dec->mpp,"mpp_dec_parser");
    dec->thread_parser = this;
    MppThread::start(this);
    this = (MppThread *)operator_new(0x198);
    MppThread::MppThread(this,mpp_dec_hal_thread,dec->mpp,"mpp_dec_hal");
    dec->thread_hal = this;
  }
  MppThread::start(this);
  return MPP_OK;
}

Assistant:

MPP_RET mpp_dec_start_normal(MppDecImpl *dec)
{
    if (dec->coding != MPP_VIDEO_CodingMJPEG) {
        dec->thread_parser = new MppThread(mpp_dec_parser_thread,
                                           dec->mpp, "mpp_dec_parser");
        dec->thread_parser->start();
        dec->thread_hal = new MppThread(mpp_dec_hal_thread,
                                        dec->mpp, "mpp_dec_hal");

        dec->thread_hal->start();
    } else {
        dec->thread_parser = new MppThread(mpp_dec_advanced_thread,
                                           dec->mpp, "mpp_dec_parser");
        dec->thread_parser->start();
    }

    return MPP_OK;
}